

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
webfront::http::Headers::getHeaderValue_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Headers *this,string_view headerName)

{
  pointer pHVar1;
  pointer pHVar2;
  pointer pcVar3;
  bool bVar4;
  pointer pHVar5;
  bool bVar6;
  string_view s1;
  string_view s1_00;
  
  pHVar1 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pHVar1 == pHVar2;
  if (!bVar6) {
    s1._M_str = (pHVar1->name)._M_dataplus._M_p;
    s1._M_len = (pHVar1->name)._M_string_length;
    bVar4 = caseInsensitiveEqual(s1,headerName);
    while (!bVar4) {
      pHVar5 = pHVar1 + 1;
      bVar6 = pHVar5 == pHVar2;
      if (bVar6) goto LAB_00125eac;
      s1_00._M_str = (pHVar5->name)._M_dataplus._M_p;
      s1_00._M_len = pHVar1[1].name._M_string_length;
      bVar4 = caseInsensitiveEqual(s1_00,headerName);
      pHVar1 = pHVar5;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10);
    pcVar3 = (pHVar1->value)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pHVar1->value)._M_string_length);
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  }
LAB_00125eac:
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::optional<std::string> getHeaderValue(std::string_view headerName) const {
        for (auto& header : headers)
            if (caseInsensitiveEqual(header.name, headerName)) return header.value;
        return {};
    }